

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::buildStateTable(RBBITableBuilder *this)

{
  UBool UVar1;
  int32_t iVar2;
  int index;
  RBBIStateDescriptor *this_00;
  UVector *pUVar3;
  RBBIStateDescriptor *this_01;
  char *pcVar4;
  int *piVar5;
  RBBIStateDescriptor *this_02;
  void *pvVar6;
  RBBIStateDescriptor *pRVar7;
  UErrorCode *pUVar8;
  uint lastInputSymbol;
  uint index_00;
  RBBIStateDescriptor *in_RSI;
  int iVar9;
  RBBIStateDescriptor *local_48;
  
  if (U_ZERO_ERROR < *this->fStatus) {
    return;
  }
  iVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  this_00 = (RBBIStateDescriptor *)UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
  pUVar8 = this->fStatus;
  if (this_00 == (RBBIStateDescriptor *)0x0) {
LAB_00308a03:
    *pUVar8 = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    lastInputSymbol = iVar2 - 1;
    in_RSI = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
    RBBIStateDescriptor::RBBIStateDescriptor(this_00,lastInputSymbol,pUVar8);
    pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
    if (pUVar3 == (UVector *)0x0) {
      this_00->fPositions = (UVector *)0x0;
      *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      in_RSI = (RBBIStateDescriptor *)this->fStatus;
      UVector::UVector(pUVar3,(UErrorCode *)in_RSI);
      this_00->fPositions = pUVar3;
      if ((*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) &&
         (in_RSI = this_00, UVector::addElement(this->fDStates,this_00,this->fStatus),
         *this->fStatus < U_ILLEGAL_ARGUMENT_ERROR)) {
        this_01 = (RBBIStateDescriptor *)UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
        pUVar8 = this->fStatus;
        if (this_01 != (RBBIStateDescriptor *)0x0) {
          in_RSI = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
          RBBIStateDescriptor::RBBIStateDescriptor(this_01,lastInputSymbol,pUVar8);
          if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
            pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)in_RSI);
            if (pUVar3 == (UVector *)0x0) {
              this_01->fPositions = (UVector *)0x0;
              *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
            }
            else {
              in_RSI = (RBBIStateDescriptor *)this->fStatus;
              UVector::UVector(pUVar3,(UErrorCode *)in_RSI);
              this_01->fPositions = pUVar3;
              if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
                setAdd(this,pUVar3,(*this->fTree)->fFirstPosSet);
                in_RSI = this_01;
                UVector::addElement(this->fDStates,this_01,this->fStatus);
                if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
                  index_00 = 1;
                  do {
                    do {
                      if (this->fDStates->count <= (int)index_00) {
                        return;
                      }
                      in_RSI = (RBBIStateDescriptor *)(ulong)index_00;
                      pcVar4 = (char *)UVector::elementAt(this->fDStates,index_00);
                      index_00 = index_00 + 1;
                    } while (*pcVar4 != '\0');
                    *pcVar4 = '\x01';
                    for (index = 1; index < iVar2; index = index + 1) {
                      local_48 = (RBBIStateDescriptor *)0x0;
                      pRVar7 = (RBBIStateDescriptor *)0x0;
                      while( true ) {
                        iVar9 = (int)pRVar7;
                        if ((*(UVector **)(pcVar4 + 0x20))->count <= iVar9) break;
                        piVar5 = (int *)UVector::elementAt(*(UVector **)(pcVar4 + 0x20),iVar9);
                        if ((*piVar5 == 3) && (piVar5[0x1f] == index)) {
                          this_02 = local_48;
                          if (local_48 == (RBBIStateDescriptor *)0x0) {
                            this_02 = (RBBIStateDescriptor *)
                                      UMemory::operator_new((UMemory *)0x28,0);
                            pUVar8 = this->fStatus;
                            in_RSI = local_48;
                            if (this_02 == (RBBIStateDescriptor *)0x0) goto LAB_00308c3d;
                            UVector::UVector((UVector *)this_02,pUVar8);
                          }
                          pRVar7 = this_02;
                          setAdd(this,(UVector *)this_02,*(UVector **)(piVar5 + 0x26));
                          local_48 = this_02;
                        }
                        in_RSI = pRVar7;
                        pRVar7 = (RBBIStateDescriptor *)(ulong)(iVar9 + 1);
                      }
                      if (local_48 != (RBBIStateDescriptor *)0x0) {
                        pRVar7 = (RBBIStateDescriptor *)0x0;
                        while( true ) {
                          iVar9 = (int)pRVar7;
                          if (this->fDStates->count <= iVar9) break;
                          pvVar6 = UVector::elementAt(this->fDStates,iVar9);
                          in_RSI = *(RBBIStateDescriptor **)((long)pvVar6 + 0x20);
                          UVar1 = UVector::equals((UVector *)local_48,(UVector *)in_RSI);
                          if (UVar1 != '\0') {
                            (**(code **)(*(long *)local_48 + 8))();
                            in_RSI = pRVar7;
                            goto LAB_00308c00;
                          }
                          pRVar7 = (RBBIStateDescriptor *)(ulong)(iVar9 + 1);
                        }
                        pRVar7 = (RBBIStateDescriptor *)
                                 UMemory::operator_new((UMemory *)0x30,(size_t)in_RSI);
                        pUVar8 = this->fStatus;
                        if (pRVar7 == (RBBIStateDescriptor *)0x0) {
LAB_00308c3d:
                          *pUVar8 = U_MEMORY_ALLOCATION_ERROR;
                        }
                        else {
                          in_RSI = (RBBIStateDescriptor *)(ulong)lastInputSymbol;
                          RBBIStateDescriptor::RBBIStateDescriptor(pRVar7,lastInputSymbol,pUVar8);
                          pUVar8 = this->fStatus;
                          if (*pUVar8 < U_ILLEGAL_ARGUMENT_ERROR) {
                            pRVar7->fPositions = (UVector *)local_48;
                            UVector::addElement(this->fDStates,pRVar7,pUVar8);
                            if (U_ZERO_ERROR < *this->fStatus) {
                              return;
                            }
                            in_RSI = (RBBIStateDescriptor *)(ulong)(this->fDStates->count - 1);
LAB_00308c00:
                            UVector32::setElementAt
                                      (*(UVector32 **)(pcVar4 + 0x28),(int32_t)in_RSI,index);
                            goto LAB_00308c10;
                          }
                        }
                        if (this_01 != (RBBIStateDescriptor *)0x0) goto LAB_003089f9;
                        goto LAB_00308a1a;
                      }
LAB_00308c10:
                    }
                    index_00 = 1;
                  } while( true );
                }
              }
            }
          }
LAB_003089f9:
          RBBIStateDescriptor::~RBBIStateDescriptor(this_01);
          goto LAB_00308a1d;
        }
        goto LAB_00308a03;
      }
    }
  }
LAB_00308a1a:
  this_01 = (RBBIStateDescriptor *)0x0;
LAB_00308a1d:
  UMemory::operator_delete((UMemory *)this_01,in_RSI);
  if (this_00 != (RBBIStateDescriptor *)0x0) {
    RBBIStateDescriptor::~RBBIStateDescriptor(this_00);
  }
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  return;
}

Assistant:

void RBBITableBuilder::buildStateTable() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    RBBIStateDescriptor *failState;
    // Set it to NULL to avoid uninitialized warning
    RBBIStateDescriptor *initialState = NULL; 
    //
    // Add a dummy state 0 - the stop state.  Not from Aho.
    int      lastInputSymbol = fRB->fSetBuilder->getNumCharCategories() - 1;
    failState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
    if (failState == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        goto ExitBuildSTdeleteall;
    }
    failState->fPositions = new UVector(*fStatus);
    if (failState->fPositions == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (failState->fPositions == NULL || U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    fDStates->addElement(failState, *fStatus);
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }

    // initially, the only unmarked state in Dstates is firstpos(root),
    //       where toot is the root of the syntax tree for (r)#;
    initialState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
    if (initialState == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    initialState->fPositions = new UVector(*fStatus);
    if (initialState->fPositions == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }
    setAdd(initialState->fPositions, fTree->fFirstPosSet);
    fDStates->addElement(initialState, *fStatus);
    if (U_FAILURE(*fStatus)) {
        goto ExitBuildSTdeleteall;
    }

    // while there is an unmarked state T in Dstates do begin
    for (;;) {
        RBBIStateDescriptor *T = NULL;
        int32_t              tx;
        for (tx=1; tx<fDStates->size(); tx++) {
            RBBIStateDescriptor *temp;
            temp = (RBBIStateDescriptor *)fDStates->elementAt(tx);
            if (temp->fMarked == FALSE) {
                T = temp;
                break;
            }
        }
        if (T == NULL) {
            break;
        }

        // mark T;
        T->fMarked = TRUE;

        // for each input symbol a do begin
        int32_t  a;
        for (a = 1; a<=lastInputSymbol; a++) {
            // let U be the set of positions that are in followpos(p)
            //    for some position p in T
            //    such that the symbol at position p is a;
            UVector    *U = NULL;
            RBBINode   *p;
            int32_t     px;
            for (px=0; px<T->fPositions->size(); px++) {
                p = (RBBINode *)T->fPositions->elementAt(px);
                if ((p->fType == RBBINode::leafChar) &&  (p->fVal == a)) {
                    if (U == NULL) {
                        U = new UVector(*fStatus);
                        if (U == NULL) {
                        	*fStatus = U_MEMORY_ALLOCATION_ERROR;
                        	goto ExitBuildSTdeleteall;
                        }
                    }
                    setAdd(U, p->fFollowPos);
                }
            }

            // if U is not empty and not in DStates then
            int32_t  ux = 0;
            UBool    UinDstates = FALSE;
            if (U != NULL) {
                U_ASSERT(U->size() > 0);
                int  ix;
                for (ix=0; ix<fDStates->size(); ix++) {
                    RBBIStateDescriptor *temp2;
                    temp2 = (RBBIStateDescriptor *)fDStates->elementAt(ix);
                    if (setEquals(U, temp2->fPositions)) {
                        delete U;
                        U  = temp2->fPositions;
                        ux = ix;
                        UinDstates = TRUE;
                        break;
                    }
                }

                // Add U as an unmarked state to Dstates
                if (!UinDstates)
                {
                    RBBIStateDescriptor *newState = new RBBIStateDescriptor(lastInputSymbol, fStatus);
                    if (newState == NULL) {
                    	*fStatus = U_MEMORY_ALLOCATION_ERROR;
                    }
                    if (U_FAILURE(*fStatus)) {
                        goto ExitBuildSTdeleteall;
                    }
                    newState->fPositions = U;
                    fDStates->addElement(newState, *fStatus);
                    if (U_FAILURE(*fStatus)) {
                        return;
                    }
                    ux = fDStates->size()-1;
                }

                // Dtran[T, a] := U;
                T->fDtran->setElementAt(ux, a);
            }
        }
    }
    return;
    // delete local pointers only if error occured.
ExitBuildSTdeleteall:
    delete initialState;
    delete failState;
}